

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O0

_Bool adt_bytearray_data_equals(adt_bytearray_t *self,uint8_t *data,uint32_t dataLen)

{
  uint32_t uVar1;
  int iVar2;
  uint8_t *myData;
  uint32_t myLen;
  uint32_t dataLen_local;
  uint8_t *data_local;
  adt_bytearray_t *self_local;
  
  if (((self == (adt_bytearray_t *)0x0) || (data == (uint8_t *)0x0)) ||
     (uVar1 = adt_bytearray_length(self), uVar1 != dataLen)) {
    self_local._7_1_ = false;
  }
  else if (uVar1 == 0) {
    self_local._7_1_ = true;
  }
  else {
    iVar2 = memcmp(self->pData,data,(ulong)uVar1);
    self_local._7_1_ = iVar2 == 0;
  }
  return self_local._7_1_;
}

Assistant:

bool adt_bytearray_data_equals(const adt_bytearray_t* self, const uint8_t* data, uint32_t dataLen)
{
   if ( (self != 0) && (data != 0) )
   {
      uint32_t myLen;
      myLen = adt_bytearray_length(self);
      if (myLen == dataLen)
      {
         const uint8_t* myData = self->pData;
         if (myLen == 0u)
         {
            return true;
         }
         else
         {
            return (memcmp(myData, data, myLen) == 0) ? true : false;
         }
      }
   }
   return false;
}